

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::fill<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,
          FixedArray<char,_1UL> *rest,StringTree *rest_1,FixedArray<char,_1UL> *rest_2)

{
  Branch *pBVar1;
  char *pcVar2;
  
  pcVar2 = (char *)(this->text).content.size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (this->text).content.ptr;
  }
  pBVar1 = (this->branches).ptr + branchIndex;
  pBVar1->index = (long)pos - (long)pcVar2;
  operator=(&pBVar1->content,first);
  fill<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (this,pos,branchIndex + 1,rest,rest_1,rest_2);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}